

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O3

int Inta_ManProofRecordOne(Inta_Man_t *p,Sto_Cls_t *pClause)

{
  Sto_Cls_t **ppSVar1;
  long lVar2;
  Sto_Cls_t *pSVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar5 = *(uint *)&pClause->field_0x1c;
  if ((uVar5 & 0x7fffff8) == 0) {
    __assert_fail("pClause->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2d5,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  if ((uVar5 & 2) != 0) {
    __assert_fail("!pClause->fRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2d9,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  if (p->nTrailSize != p->nRootSize) {
    __assert_fail("p->nTrailSize == p->nRootSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2da,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  uVar4 = uVar5 >> 3 & 0xffffff;
  if (uVar4 != 0) {
    uVar11 = 0;
    do {
      iVar9 = *(int *)((long)&pClause[1].pNext + uVar11 * 4);
      if (p->pAssigns[iVar9 >> 1] == iVar9) {
        return 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  uVar11 = 0;
  do {
    uVar4 = *(uint *)((long)&pClause[1].pNext + uVar11 * 4);
    uVar8 = uVar4 ^ 1;
    iVar9 = (int)uVar4 >> 1;
    uVar4 = p->pAssigns[iVar9];
    if (uVar4 == 0xffffffff) {
      p->pAssigns[iVar9] = uVar8;
      p->pReasons[iVar9] = (Sto_Cls_t *)0x0;
      iVar9 = p->nTrailSize;
      p->nTrailSize = iVar9 + 1;
      p->pTrail[iVar9] = uVar8;
      uVar5 = *(uint *)&pClause->field_0x1c;
    }
    else if (uVar4 != uVar8) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                    ,0x2e6,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 < (uVar5 >> 3 & 0xffffff));
  pSVar3 = Inta_ManPropagate(p,p->nRootSize);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2ee,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  uVar4 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  uVar5 = *(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff;
  if (uVar4 < uVar5) {
LAB_008e07d4:
    Inta_ManProofTraceOne(p,pSVar3,pClause);
    iVar9 = p->nRootSize;
    lVar7 = (long)p->nTrailSize;
    if (iVar9 < p->nTrailSize) {
      do {
        lVar2 = lVar7 + -1;
        lVar7 = lVar7 + -1;
        iVar10 = p->pTrail[lVar2] >> 1;
        p->pReasons[iVar10] = (Sto_Cls_t *)0x0;
        p->pAssigns[iVar10] = -1;
      } while (iVar9 < lVar7);
    }
    p->nTrailSize = iVar9;
    uVar5 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
    if (1 < uVar5) {
      uVar5 = *(uint *)&pClause[1].pNext;
      if ((-1 < (int)uVar5) && ((int)(uVar5 >> 1) < p->pCnf->nVars)) {
        ppSVar1 = p->pWatches;
        pClause->pNext0 = ppSVar1[(ulong)uVar5 ^ 1];
        ppSVar1[(ulong)uVar5 ^ 1] = pClause;
        uVar4 = *(uint *)((long)&pClause[1].pNext + 4);
        if ((-1 < (int)uVar4) && ((int)(uVar4 >> 1) < p->pCnf->nVars)) {
          ppSVar1 = p->pWatches;
          (&pClause->pNext0)[uVar5 != uVar4] = ppSVar1[(ulong)uVar4 ^ 1];
          ppSVar1[(ulong)uVar4 ^ 1] = pClause;
          return 1;
        }
      }
      __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                    ,0x15a,"void Inta_ManWatchClause(Inta_Man_t *, Sto_Cls_t *, lit)");
    }
    if (uVar5 != 1) {
      __assert_fail("pClause->nLits == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                    ,0x314,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
    }
    iVar9 = *(int *)&pClause[1].pNext;
    iVar6 = iVar9 >> 1;
    iVar10 = p->pAssigns[iVar6];
    if (iVar10 == -1) {
      p->pAssigns[iVar6] = iVar9;
      p->pReasons[iVar6] = pClause;
      iVar10 = p->nTrailSize;
      p->nTrailSize = iVar10 + 1;
      p->pTrail[iVar10] = iVar9;
    }
    else if (iVar10 != iVar9) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                    ,0x319,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
    }
    pSVar3 = Inta_ManPropagate(p,p->nRootSize);
    if (pSVar3 != (Sto_Cls_t *)0x0) {
      Inta_ManProofTraceOne(p,pSVar3,p->pCnf->pEmpty);
      return 0;
    }
    p->nRootSize = p->nTrailSize;
  }
  else {
    uVar11 = 0;
    if (uVar5 == 0) {
LAB_008e078e:
      if ((uint)uVar11 != uVar5) goto LAB_008e07d4;
    }
    else {
      do {
        uVar12 = 0;
        while (*(int *)((long)&pSVar3[1].pNext + uVar11 * 4) !=
               *(int *)((long)&pClause[1].pNext + uVar12 * 4)) {
          uVar12 = uVar12 + 1;
          if (uVar4 == uVar12) goto LAB_008e078e;
        }
        if (uVar4 == (uint)uVar12) goto LAB_008e078e;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar5);
    }
    iVar9 = p->nRootSize;
    lVar7 = (long)p->nTrailSize;
    if (iVar9 < p->nTrailSize) {
      do {
        lVar2 = lVar7 + -1;
        lVar7 = lVar7 + -1;
        iVar10 = p->pTrail[lVar2] >> 1;
        p->pReasons[iVar10] = (Sto_Cls_t *)0x0;
        p->pAssigns[iVar10] = -1;
      } while (iVar9 < lVar7);
    }
    p->nTrailSize = iVar9;
  }
  return 1;
}

Assistant:

int Inta_ManProofRecordOne( Inta_Man_t * p, Sto_Cls_t * pClause )
{
    Sto_Cls_t * pConflict;
    int i;

    // empty clause never ends up there
    assert( pClause->nLits > 0 );
    if ( pClause->nLits == 0 )
        printf( "Error: Empty clause is attempted.\n" );

    assert( !pClause->fRoot );
    assert( p->nTrailSize == p->nRootSize );

    // if any of the clause literals are already assumed
    // it means that the clause is redundant and can be skipped
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( p->pAssigns[lit_var(pClause->pLits[i])] == pClause->pLits[i] )
            return 1;

    // add assumptions to the trail
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( !Inta_ManEnqueue( p, lit_neg(pClause->pLits[i]), NULL ) )
        {
            assert( 0 ); // impossible
            return 0;
        }

    // propagate the assumptions
    pConflict = Inta_ManPropagate( p, p->nRootSize );
    if ( pConflict == NULL )
    {
        assert( 0 ); // cannot prove
        return 0;
    } 

    // skip the clause if it is weaker or the same as the conflict clause
    if ( pClause->nLits >= pConflict->nLits )
    {
        // check if every literal of conflict clause can be found in the given clause
        int j;
        for ( i = 0; i < (int)pConflict->nLits; i++ )
        {
            for ( j = 0; j < (int)pClause->nLits; j++ )
                if ( pConflict->pLits[i] == pClause->pLits[j] )
                    break;
            if ( j == (int)pClause->nLits ) // literal pConflict->pLits[i] is not found
                break;
        }
        if ( i == (int)pConflict->nLits ) // all lits are found
        {
            // undo to the root level
            Inta_ManCancelUntil( p, p->nRootSize );
            return 1;
        }
    }

    // construct the proof
    Inta_ManProofTraceOne( p, pConflict, pClause );

    // undo to the root level
    Inta_ManCancelUntil( p, p->nRootSize );

    // add large clauses to the watched lists
    if ( pClause->nLits > 1 )
    {
        Inta_ManWatchClause( p, pClause, pClause->pLits[0] );
        Inta_ManWatchClause( p, pClause, pClause->pLits[1] );
        return 1;
    }
    assert( pClause->nLits == 1 );

    // if the clause proved is unit, add it and propagate
    if ( !Inta_ManEnqueue( p, pClause->pLits[0], pClause ) )
    {
        assert( 0 ); // impossible
        return 0;
    }

    // propagate the assumption
    pConflict = Inta_ManPropagate( p, p->nRootSize );
    if ( pConflict )
    {
        // construct the proof
        Inta_ManProofTraceOne( p, pConflict, p->pCnf->pEmpty );
//        if ( p->fVerbose )
//            printf( "Found last conflict after adding unit clause number %d!\n", pClause->Id );
        return 0;
    }

    // update the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}